

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLcode curl_easy_pause(Curl_easy *data,int action)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  _Bool _Var4;
  _Bool _Var5;
  CURLMcode CVar6;
  CURLcode CVar7;
  uint uVar8;
  bool bVar9;
  
  if (data == (Curl_easy *)0x0) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  if (data->magic != 0xc0dedbad) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  if (data->conn == (connectdata *)0x0) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  _Var4 = Curl_is_in_callback(data);
  uVar3 = (data->req).keepon;
  uVar2 = ((action & 1U) << 4 | uVar3 & 0xffffffcf) + (action & 4U) * 8;
  uVar8 = uVar2 & 0x30;
  if ((~uVar2 & uVar3 & 0x20) == 0) {
    bVar9 = false;
  }
  else {
    bVar9 = data->mstate - MSTATE_PERFORMING < 2;
  }
  (data->req).keepon = uVar2;
  if (uVar8 != 0x30) {
    Curl_expire(data,0,EXPIRE_RUN_NOW);
    (data->state).keeps_speed.tv_sec = 0;
    if ((action & 4U) == 0) {
      puVar1 = &(data->state).select_bits;
      *puVar1 = *puVar1 | 2;
    }
    if ((action & 1U) == 0) {
      puVar1 = &(data->state).select_bits;
      *puVar1 = *puVar1 | 1;
    }
    if (((uVar8 != (uVar3 & 0x30)) && (data->multi != (Curl_multi *)0x0)) &&
       (CVar6 = Curl_update_timer(data->multi), CVar6 != CURLM_OK)) {
      CVar7 = CURLE_ABORTED_BY_CALLBACK;
      goto LAB_00123ec9;
    }
  }
  if ((!bVar9) || (CVar7 = Curl_creader_unpause(data), CVar7 == CURLE_OK)) {
    if ((((data->req).keepon & 0x10) == 0) && (_Var5 = Curl_cwriter_is_paused(data), _Var5)) {
      Curl_conn_ev_data_pause(data,false);
      CVar7 = Curl_cwriter_unpause(data);
      if (CVar7 != CURLE_OK) goto LAB_00123ec9;
    }
    CVar7 = CURLE_OK;
    if ((uVar8 != (uVar3 & 0x30)) && ((*(uint *)&(data->state).field_0x774 & 0x400) == 0)) {
      CVar7 = Curl_updatesocket(data);
    }
  }
LAB_00123ec9:
  if (_Var4) {
    Curl_set_in_callback(data,true);
  }
  return CVar7;
}

Assistant:

CURLcode curl_easy_pause(struct Curl_easy *data, int action)
{
  struct SingleRequest *k;
  CURLcode result = CURLE_OK;
  int oldstate;
  int newstate;
  bool recursive = FALSE;
  bool keep_changed, unpause_read, not_all_paused;

  if(!GOOD_EASY_HANDLE(data) || !data->conn)
    /* crazy input, do not continue */
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(Curl_is_in_callback(data))
    recursive = TRUE;
  k = &data->req;
  oldstate = k->keepon & (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE);

  /* first switch off both pause bits then set the new pause bits */
  newstate = (k->keepon &~ (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE)) |
    ((action & CURLPAUSE_RECV) ? KEEP_RECV_PAUSE : 0) |
    ((action & CURLPAUSE_SEND) ? KEEP_SEND_PAUSE : 0);

  keep_changed = ((newstate & (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE)) != oldstate);
  not_all_paused = (newstate & (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) !=
                   (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE);
  unpause_read = ((k->keepon & ~newstate & KEEP_SEND_PAUSE) &&
                  (data->mstate == MSTATE_PERFORMING ||
                   data->mstate == MSTATE_RATELIMITING));
  /* Unpausing writes is detected on the next run in
   * transfer.c:Curl_sendrecv(). This is because this may result
   * in a transfer error if the application's callbacks fail */

  /* Set the new keepon state, so it takes effect no matter what error
   * may happen afterwards. */
  k->keepon = newstate;

  /* If not completely pausing both directions now, run again in any case. */
  if(not_all_paused) {
    Curl_expire(data, 0, EXPIRE_RUN_NOW);
    /* reset the too-slow time keeper */
    data->state.keeps_speed.tv_sec = 0;
    /* Simulate socket events on next run for unpaused directions */
    if(!(newstate & KEEP_SEND_PAUSE))
      data->state.select_bits |= CURL_CSELECT_OUT;
    if(!(newstate & KEEP_RECV_PAUSE))
      data->state.select_bits |= CURL_CSELECT_IN;
    /* On changes, tell application to update its timers. */
    if(keep_changed && data->multi) {
      if(Curl_update_timer(data->multi)) {
        result = CURLE_ABORTED_BY_CALLBACK;
        goto out;
      }
    }
  }

  if(unpause_read) {
    result = Curl_creader_unpause(data);
    if(result)
      goto out;
  }

  if(!(k->keepon & KEEP_RECV_PAUSE) && Curl_cwriter_is_paused(data)) {
    Curl_conn_ev_data_pause(data, FALSE);
    result = Curl_cwriter_unpause(data);
  }

out:
  if(!result && !data->state.done && keep_changed)
    /* This transfer may have been moved in or out of the bundle, update the
       corresponding socket callback, if used */
    result = Curl_updatesocket(data);

  if(recursive)
    /* this might have called a callback recursively which might have set this
       to false again on exit */
    Curl_set_in_callback(data, TRUE);

  return result;
}